

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PField * __thiscall PStruct::AddField(PStruct *this,FName *name,PType *type,DWORD flags)

{
  int iVar1;
  PField *this_00;
  PSymbol *pPVar2;
  uint uVar3;
  uint uVar4;
  
  this_00 = (PField *)
            M_Malloc_Dbg(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  iVar1 = name->Index;
  DObject::DObject((DObject *)this_00);
  *(int *)&(this_00->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 = iVar1;
  (this_00->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f3f58;
  this_00->Type = type;
  this_00->Flags = flags;
  this_00->BitValue = -1;
  uVar3 = type->Align;
  uVar4 = -uVar3 & (*(int *)&(this->super_PNamedType).super_PCompoundType.super_PType.
                             super_PTypeBase.super_DObject.field_0x24 + uVar3) - 1;
  this_00->Offset = (ulong)uVar4;
  *(uint *)&(this->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
            field_0x24 = uVar4 + *(int *)&(type->super_PTypeBase).super_DObject.field_0x24;
  uVar4 = (this->super_PNamedType).super_PCompoundType.super_PType.Align;
  if (uVar3 < uVar4) {
    uVar3 = uVar4;
  }
  (this->super_PNamedType).super_PCompoundType.super_PType.Align = uVar3;
  pPVar2 = PSymbolTable::AddSymbol
                     (&(this->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                      (PSymbol *)this_00);
  if (pPVar2 == (PSymbol *)0x0) {
    (*(this_00->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject[2])(this_00);
    this_00 = (PField *)0x0;
  }
  else {
    TArray<PField_*,_PField_*>::Grow(&this->Fields,1);
    uVar3 = (this->Fields).Count;
    (this->Fields).Array[uVar3] = this_00;
    (this->Fields).Count = uVar3 + 1;
  }
  return this_00;
}

Assistant:

PField *PStruct::AddField(FName name, PType *type, DWORD flags)
{
	PField *field = new PField(name, type, flags);

	// The new field is added to the end of this struct, alignment permitting.
	field->Offset = (Size + (type->Align - 1)) & ~(type->Align - 1);

	// Enlarge this struct to enclose the new field.
	Size = unsigned(field->Offset + type->Size);

	// This struct's alignment is the same as the largest alignment of any of
	// its fields.
	Align = MAX(Align, type->Align);

	if (Symbols.AddSymbol(field) == NULL)
	{ // name is already in use
		delete field;
		return NULL;
	}
	Fields.Push(field);

	return field;
}